

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

HttpClient * __thiscall
kj::anon_unknown_31::NetworkHttpClient::getClient(NetworkHttpClient *this,Url *parsed)

{
  _Base_ptr *pp_Var1;
  String *pSVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  PromiseNode *pPVar5;
  Exception *pEVar6;
  HttpHeaderTable *pHVar7;
  Duration DVar8;
  Fault FVar9;
  NetworkHttpClient *pNVar10;
  Url *pUVar11;
  int iVar12;
  TransformPromiseNodeBase *pTVar13;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Base_ptr p_Var16;
  long lVar17;
  _Base_ptr p_Var18;
  _Rb_tree_node_base *p_Var19;
  Network *pNVar20;
  _Link_type __p;
  undefined8 uVar21;
  char *__s2;
  _Link_type __x;
  undefined8 unaff_R13;
  _Rb_tree_node_base *p_Var22;
  iterator iter;
  bool bVar23;
  Fault f_1;
  Fault f;
  Own<kj::_::PromiseNode> local_c8;
  Exception *local_b8;
  HttpHeaderTable *pHStack_b0;
  _Base_ptr local_a8;
  Maybe<kj::Network_&> local_a0;
  Duration local_98;
  Own<kj::_::PromiseNode> local_88;
  Fault local_78;
  HttpHeaderTable *pHStack_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  NetworkHttpClient *local_48;
  undefined4 local_3c;
  Url *local_38;
  
  sVar3 = (parsed->scheme).content.size_;
  lVar17 = sVar3 + (sVar3 == 0);
  if (sVar3 == 6) {
    iVar12 = bcmp((parsed->scheme).content.ptr,"https",lVar17 - 1);
    local_3c = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),iVar12 == 0);
  }
  else {
    local_3c = 0;
  }
  if (sVar3 == 5) {
    iVar12 = bcmp((parsed->scheme).content.ptr,"http",lVar17 - 1);
    bVar23 = iVar12 == 0;
  }
  else {
    bVar23 = false;
  }
  if (!bVar23 && (char)local_3c == '\0') {
    local_78.exception = (Exception *)0x0;
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    _::Debug::Fault::init
              (&local_78,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
              );
    _::Debug::Fault::fatal(&local_78);
  }
  iter._M_node = (_Base_ptr)&this->httpHosts;
  if ((char)local_3c != '\0') {
    iter._M_node = (_Base_ptr)&this->httpsHosts;
  }
  sVar3 = (parsed->host).content.size_;
  if (sVar3 == 0) {
    __s2 = "";
  }
  else {
    __s2 = (parsed->host).content.ptr;
  }
  p_Var18 = (_Base_ptr)(sVar3 + (sVar3 == 0));
  pp_Var1 = &(iter._M_node)->_M_parent;
  p_Var14 = (_Rb_tree_node_base *)pp_Var1;
  local_48 = this;
  local_38 = parsed;
  for (p_Var19 = (iter._M_node)->_M_left; p_Var19 != (_Rb_tree_node_base *)0x0;
      p_Var19 = (&p_Var19->_M_left)[iVar12 < 0 || iVar12 == 0 && p_Var4 < p_Var18]) {
    p_Var4 = p_Var19[1]._M_parent;
    p_Var16 = p_Var18;
    if (p_Var4 < p_Var18) {
      p_Var16 = p_Var4;
    }
    iVar12 = memcmp(*(void **)(p_Var19 + 1),__s2,(size_t)p_Var16);
    if (iVar12 >= 0 && (iVar12 != 0 || p_Var4 >= p_Var18)) {
      p_Var14 = p_Var19;
    }
  }
  p_Var19 = (_Rb_tree_node_base *)pp_Var1;
  if (p_Var14 != (_Rb_tree_node_base *)pp_Var1) {
    p_Var4 = p_Var14[1]._M_parent;
    p_Var16 = p_Var4;
    if (p_Var18 < p_Var4) {
      p_Var16 = p_Var18;
    }
    iVar12 = memcmp(__s2,*(void **)(p_Var14 + 1),(size_t)p_Var16);
    p_Var19 = p_Var14;
    if (iVar12 == 0) {
      p_Var19 = (_Rb_tree_node_base *)pp_Var1;
    }
    if (p_Var4 <= p_Var18) {
      p_Var19 = p_Var14;
    }
    if (iVar12 < 0) {
      p_Var19 = (_Rb_tree_node_base *)pp_Var1;
    }
  }
  pNVar10 = local_48;
  if (p_Var19 != (_Rb_tree_node_base *)pp_Var1) goto LAB_002e76fe;
  if ((char)local_3c == '\0') {
    pNVar20 = local_48->network;
    uVar21 = 0x50;
  }
  else {
    pNVar20 = (local_48->tlsNetwork).ptr;
    uVar21 = 0x1bb;
    if (pNVar20 == (Network *)0x0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
                ((Fault *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0xf34,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support HTTPS\"",
                 (char (*) [38])"this HttpClient doesn\'t support HTTPS");
      _::Debug::Fault::fatal((Fault *)&local_c8);
    }
  }
  (**pNVar20->_vptr_Network)(&local_c8,pNVar20,__s2,p_Var18,uVar21);
  pTVar13 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar13,&local_c8,
             _::
             TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3896:17),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pUVar11 = local_38;
  pPVar5 = local_c8.ptr;
  pSVar2 = &local_38->host;
  (pTVar13->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00461d80;
  pTVar13[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)pNVar10;
  if (local_c8.ptr != (PromiseNode *)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    (**(local_c8.disposer)->_vptr_Disposer)
              (local_c8.disposer,(_func_int *)((long)pPVar5 + (long)pPVar5->_vptr_PromiseNode[-2]));
  }
  local_78.exception = (Exception *)(pUVar11->host).content.ptr;
  pHStack_70 = (HttpHeaderTable *)(pUVar11->host).content.size_;
  local_68 = (_Base_ptr)(pUVar11->host).content.disposer;
  (pSVar2->content).ptr = (char *)0x0;
  (pUVar11->host).content.size_ = 0;
  p_Var18 = (_Base_ptr)operator_new(0x30);
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::Own<kj::NetworkAddress>,kj::(anonymous_namespace)::NetworkHttpClient::getClient(kj::Url&)::{lambda(kj::Own<kj::NetworkAddress>)#1},kj::_::PropagateException>>
        ::instance;
  *(undefined ***)p_Var18 = &PTR_request_00461e08;
  local_88.ptr = (PromiseNode *)pTVar13;
  pTVar13 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar13,&local_88,
             _::
             TransformPromiseNode<kj::_::Void,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3735:30),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (pTVar13->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00461e48;
  pTVar13[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)p_Var18;
  local_c8.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>,kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient::PromiseNetworkAddressHttpClient(kj::Promise<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>>)::{lambda(kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_c8.ptr = (PromiseNode *)pTVar13;
  Promise<void>::fork((Promise<void> *)&p_Var18->_M_parent);
  pPVar5 = local_c8.ptr;
  if ((TransformPromiseNodeBase *)local_c8.ptr != (TransformPromiseNodeBase *)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    (**(local_c8.disposer)->_vptr_Disposer)
              (local_c8.disposer,(long)pPVar5 + *(long *)(*(_func_int **)pPVar5 + -0x10));
  }
  pPVar5 = local_88.ptr;
  p_Var18->_M_right = (_Base_ptr)0x0;
  *(_func_int **)(p_Var18 + 1) = (_func_int *)0x0;
  *(undefined1 *)&p_Var18[1]._M_parent = 0;
  local_60 = (_Base_ptr)
             &_::HeapDisposer<kj::(anonymous_namespace)::PromiseNetworkAddressHttpClient>::instance;
  local_58 = p_Var18;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar5->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  local_c8.disposer = (Disposer *)(Exception *)0x385fb3;
  if (pHStack_70 != (HttpHeaderTable *)0x0) {
    local_c8.disposer = (Disposer *)local_78.exception;
  }
  __p = (_Link_type)
        ((long)&(pHStack_70->namesById).builder.ptr + (ulong)(pHStack_70 == (HttpHeaderTable *)0x0))
  ;
  local_b8 = local_78.exception;
  pHStack_b0 = pHStack_70;
  local_a8 = local_68;
  local_78.exception = (Exception *)0x0;
  pHStack_70 = (HttpHeaderTable *)0x0;
  local_a0.ptr = (Network *)local_60;
  local_98.value = (long)local_58;
  local_58 = (_Base_ptr)0x0;
  local_c8.ptr = (PromiseNode *)__p;
  p_Var14 = (_Rb_tree_node_base *)operator_new(0x58);
  __x = (_Link_type)(p_Var14 + 1);
  *(Disposer **)(p_Var14 + 1) = local_c8.disposer;
  p_Var14[1]._M_parent = (_Base_ptr)local_c8.ptr;
  p_Var14[1]._M_left = (_Base_ptr)local_b8;
  p_Var14[1]._M_right = (_Base_ptr)pHStack_b0;
  *(_Base_ptr *)(p_Var14 + 2) = local_a8;
  local_b8 = (Exception *)0x0;
  pHStack_b0 = (HttpHeaderTable *)0x0;
  p_Var14[2]._M_parent = (_Base_ptr)local_a0.ptr;
  p_Var14[2]._M_left = (_Base_ptr)local_98.value;
  local_98.value = 0;
  p_Var19 = (iter._M_node)->_M_left;
  if (p_Var19 == (_Rb_tree_node_base *)0x0) {
    bVar23 = true;
    p_Var22 = (_Rb_tree_node_base *)pp_Var1;
  }
  else {
    do {
      p_Var22 = p_Var19;
      __p = __x;
      bVar23 = std::less<kj::StringPtr>::operator()
                         ((less<kj::StringPtr> *)iter._M_node,(StringPtr *)__x,
                          (StringPtr *)(p_Var22 + 1));
      p_Var19 = (&p_Var22->_M_left)[!bVar23];
    } while (p_Var19 != (_Base_ptr)0x0);
  }
  p_Var15 = p_Var22;
  if (bVar23 == false) {
LAB_002e758f:
    __p = (_Link_type)(p_Var15 + 1);
    bVar23 = std::less<kj::StringPtr>::operator()
                       ((less<kj::StringPtr> *)iter._M_node,(StringPtr *)__p,(StringPtr *)__x);
    if (!bVar23) {
      p_Var19 = p_Var15;
      p_Var22 = (_Rb_tree_node_base *)0x0;
    }
  }
  else if (p_Var22 != (iter._M_node)->_M_right) {
    p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var22);
    goto LAB_002e758f;
  }
  if (p_Var22 == (_Rb_tree_node_base *)0x0) {
    std::
    _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
    ::_M_drop_node((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                    *)p_Var14,__p);
  }
  else {
    bVar23 = true;
    if ((p_Var19 == (_Rb_tree_node_base *)0x0) && ((_Rb_tree_node_base *)pp_Var1 != p_Var22)) {
      bVar23 = std::less<kj::StringPtr>::operator()
                         ((less<kj::StringPtr> *)iter._M_node,(StringPtr *)__x,
                          (StringPtr *)(p_Var22 + 1));
    }
    std::_Rb_tree_insert_and_rebalance(bVar23,p_Var14,p_Var22,(_Rb_tree_node_base *)pp_Var1);
    iter._M_node[1]._M_parent = (_Base_ptr)((long)&(iter._M_node[1]._M_parent)->_M_color + 1);
    p_Var19 = p_Var14;
  }
  DVar8.value = local_98.value;
  if ((long *)local_98.value != (long *)0x0) {
    local_98.value = 0;
    (**(local_a0.ptr)->_vptr_Network)(local_a0.ptr,DVar8.value + *(long *)(*DVar8.value + -0x10));
  }
  pHVar7 = pHStack_b0;
  pEVar6 = local_b8;
  if (local_b8 != (Exception *)0x0) {
    local_b8 = (Exception *)0x0;
    pHStack_b0 = (HttpHeaderTable *)0x0;
    (***(_func_int ***)local_a8)(local_a8,pEVar6,1,pHVar7,pHVar7,0);
  }
  pNVar10 = local_48;
  if (p_Var22 == (_Rb_tree_node_base *)0x0) {
    local_88.disposer = (Disposer *)0x0;
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (PromiseNode *)0x0;
    _::Debug::Fault::init
              ((Fault *)&local_88,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
              );
    _::Debug::Fault::fatal((Fault *)&local_88);
  }
  handleCleanup((NetworkHttpClient *)&local_c8,
                (map<kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::(anonymous_namespace)::NetworkHttpClient::Host>_>_>
                 *)local_48,iter);
  TaskSet::add(&pNVar10->tasks,(Promise<void> *)&local_c8);
  pPVar5 = local_c8.ptr;
  if ((_Link_type)local_c8.ptr != (_Link_type)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    (**(code **)*(_func_int **)local_c8.disposer)
              (local_c8.disposer,(long)pPVar5 + *(long *)(*(_func_int **)pPVar5 + -0x10));
  }
  p_Var18 = local_58;
  if (local_58 != (_Base_ptr)0x0) {
    local_58 = (_Base_ptr)0x0;
    (*(code *)**(undefined8 **)local_60)
              (local_60,(long)p_Var18 + *(long *)(*(long *)p_Var18 + -0x10));
  }
  pHVar7 = pHStack_70;
  FVar9.exception = local_78.exception;
  if (local_78.exception != (Exception *)0x0) {
    local_78.exception = (Exception *)0x0;
    pHStack_70 = (HttpHeaderTable *)0x0;
    (***(_func_int ***)local_68)(local_68,FVar9.exception,1,pHVar7,pHVar7,0);
  }
LAB_002e76fe:
  return (HttpClient *)p_Var19[2]._M_left;
}

Assistant:

HttpClient& getClient(kj::Url& parsed) {
    bool isHttps = parsed.scheme == "https";
    bool isHttp = parsed.scheme == "http";
    KJ_REQUIRE(isHttp || isHttps);

    auto& hosts = isHttps ? httpsHosts : httpHosts;

    // Look for a cached client for this host.
    // TODO(perf): It would be nice to recognize when different hosts have the same address and
    //   reuse the same connection pool, but:
    //   - We'd need a reliable way to compare NetworkAddresses, e.g. .equals() and .hashCode().
    //     It's very Java... ick.
    //   - Correctly handling TLS would be tricky: we'd need to verify that the new hostname is
    //     on the certificate. When SNI is in use we might have to request an additional
    //     certificate (is that possible?).
    auto iter = hosts.find(parsed.host);

    if (iter == hosts.end()) {
      // Need to open a new connection.
      kj::Network* networkToUse = &network;
      if (isHttps) {
        networkToUse = &KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support HTTPS");
      }

      auto promise = networkToUse->parseAddress(parsed.host, isHttps ? 443 : 80)
          .then([this](kj::Own<kj::NetworkAddress> addr) {
        return kj::heap<NetworkAddressHttpClient>(
            timer, responseHeaderTable, kj::mv(addr), settings);
      });

      Host host {
        kj::mv(parsed.host),
        kj::heap<PromiseNetworkAddressHttpClient>(kj::mv(promise))
      };
      kj::StringPtr nameRef = host.name;

      auto insertResult = hosts.insert(std::make_pair(nameRef, kj::mv(host)));
      KJ_ASSERT(insertResult.second);
      iter = insertResult.first;

      tasks.add(handleCleanup(hosts, iter));
    }

    return *iter->second.client;
  }